

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# vmimgrb.cpp
# Opt level: O0

void CVmObjDict::cvt_const_cb(void *ctx0,CVmHashEntry *entry0)

{
  ulong uVar1;
  char *pcVar2;
  size_t sVar3;
  CVmHashEntryDict *in_RSI;
  undefined8 *in_RDI;
  vm_dict_entry *cur;
  CVmHashEntryDict *entry;
  cvt_const_ctx *ctx;
  vm_dict_entry *local_28;
  
  local_28 = CVmHashEntryDict::get_head(in_RSI);
  while( true ) {
    if (local_28 == (vm_dict_entry *)0x0) {
      return;
    }
    uVar1 = CVmConstMapper::get_pool_addr((CVmConstMapper *)*in_RDI,local_28->obj_);
    if (uVar1 != 0) break;
    local_28 = local_28->nxt_;
  }
  pcVar2 = CVmHashEntry::getstr((CVmHashEntry *)in_RSI);
  sVar3 = CVmHashEntry::getlen((CVmHashEntry *)in_RSI);
  err_throw_a(0x7e5,1,4,pcVar2,sVar3);
}

Assistant:

void CVmObjDict::cvt_const_cb(void *ctx0, class CVmHashEntry *entry0)
{
    cvt_const_ctx *ctx = (cvt_const_ctx *)ctx0;
    CVmHashEntryDict *entry = (CVmHashEntryDict *)entry0;
    vm_dict_entry *cur;

    /* inspect the items in this entry's list */
    for (cur = entry->get_head() ; cur != 0 ; cur = cur->nxt_)
    {
        /* if this item refers to constant data, it's an error */
        if (ctx->mapper->get_pool_addr(cur->obj_) != 0)
            err_throw_a(VMERR_DICT_NO_CONST, 1, ERR_TYPE_TEXTCHAR_LEN,
                        entry->getstr(), entry->getlen());
    }
}